

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibImplementGatesArea
              (Sfm_Lib_t *p,int *pFanins,int nFanins,int iObj,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  char cVar1;
  char cVar2;
  Mio_Cell2_t *pMVar3;
  Sfm_Fun_t *pSVar4;
  int iVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar6;
  Vec_Int_t *pVVar7;
  Mio_Cell2_t *pMVar8;
  ulong uVar9;
  int Entry;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pMVar3 = p->pCells;
  pSVar4 = p->pObjs;
  cVar1 = pSVar4[iObj].pFansB[0];
  cVar2 = pSVar4[iObj].pFansT[0];
  pMVar6 = Mio_LibraryReadGateByName(pLib,pMVar3[cVar1].pName,(char *)0x0);
  if (pMVar6 != (Mio_Gate_t *)pMVar3[cVar1].pMioGate) {
    __assert_fail("pGate == pCellB->pMioGate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2cd,
                  "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  pMVar8 = pMVar3 + cVar2;
  iVar5 = Mio_GateReadValue(pMVar6);
  Vec_IntPush(vGates,iVar5);
  pVVar7 = Vec_WecPushLevel(vFanins);
  for (uVar9 = 0; uVar9 < *(uint *)&pMVar3[cVar1].field_0x10 >> 0x1c; uVar9 = uVar9 + 1) {
    Vec_IntPush(pVVar7,pFanins[pSVar4[iObj].pFansB[uVar9 + 1]]);
  }
  if (pMVar8 == p->pCells) {
    iVar5 = 1;
  }
  else {
    pMVar6 = Mio_LibraryReadGateByName(pLib,pMVar8->pName,(char *)0x0);
    if (pMVar6 != (Mio_Gate_t *)pMVar8->pMioGate) {
      __assert_fail("pGate == pCellT->pMioGate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x2d6,
                    "int Sfm_LibImplementGatesArea(Sfm_Lib_t *, int *, int, int, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    iVar5 = Mio_GateReadValue(pMVar6);
    Vec_IntPush(vGates,iVar5);
    pVVar7 = Vec_WecPushLevel(vFanins);
    iVar5 = 2;
    for (uVar9 = 0; uVar9 < *(uint *)&pMVar8->field_0x10 >> 0x1c; uVar9 = uVar9 + 1) {
      if ((long)pSVar4[iObj].pFansT[uVar9 + 1] == 0x10) {
        Entry = vFanins->nSize + -2;
      }
      else {
        Entry = pFanins[pSVar4[iObj].pFansT[uVar9 + 1]];
      }
      Vec_IntPush(pVVar7,Entry);
    }
  }
  return iVar5;
}

Assistant:

int Sfm_LibImplementGatesArea( Sfm_Lib_t * p, int * pFanins, int nFanins, int iObj, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Sfm_Fun_t * pObjMin = p->pObjs + iObj;
    Mio_Cell2_t * pCellB, * pCellT;
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    int i;
    // get the gates
    pCellB = p->pCells + (int)pObjMin->pFansB[0];
    pCellT = p->pCells + (int)pObjMin->pFansT[0];
    // create bottom gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellB->pName, NULL );
    assert( pGate == pCellB->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellB->nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansB[i+1]] );
    if ( pCellT == p->pCells )
        return 1;
    // create top gate
    pGate = Mio_LibraryReadGateByName( pLib, pCellT->pName, NULL );
    assert( pGate == pCellT->pMioGate );
    Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
    vLevel = Vec_WecPushLevel( vFanins );
    for ( i = 0; i < (int)pCellT->nFanins; i++ )
        if ( pObjMin->pFansT[i+1] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pObjMin->pFansT[i+1]] );
    return 2;
}